

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSaveFileButton.cpp
# Opt level: O2

void QSaveFileButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QStringList *filter;
  QArrayDataPointer<QString> *this;
  qsizetype qVar1;
  Data *pDVar2;
  QString *pQVar3;
  Options OVar4;
  QSaveFileButton *_t;
  QArrayDataPointer<QString> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 0) {
      filePathChanged((QSaveFileButton *)_o,(QString *)_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (4 < (uint)_id) {
      return;
    }
    this = (QArrayDataPointer<QString> *)*_a;
    switch(_id) {
    case 0:
      filePath((QString *)&local_28,(QSaveFileButton *)_o);
      break;
    case 1:
      caption((QString *)&local_28,(QSaveFileButton *)_o);
      break;
    case 2:
      directory((QString *)&local_28,(QSaveFileButton *)_o);
      break;
    case 3:
      QSaveFileButton::filter((QStringList *)&local_28,(QSaveFileButton *)_o);
      QArrayDataPointer<QString>::operator=(this,&local_28);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      return;
    case 4:
      OVar4 = options((QSaveFileButton *)_o);
      *(Int *)&this->d = OVar4.i;
      return;
    }
    pDVar2 = this->d;
    pQVar3 = this->ptr;
    this->d = local_28.d;
    this->ptr = local_28.ptr;
    qVar1 = this->size;
    this->size = local_28.size;
    local_28.d = pDVar2;
    local_28.ptr = pQVar3;
    local_28.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_28);
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      filter = (QStringList *)*_a;
      switch(_id) {
      case 0:
        setFilePath((QSaveFileButton *)_o,(QString *)filter);
        return;
      case 1:
        setCaption((QSaveFileButton *)_o,(QString *)filter);
        return;
      case 2:
        setDirectory((QSaveFileButton *)_o,(QString *)filter);
        return;
      case 3:
        setFilter((QSaveFileButton *)_o,filter);
        return;
      case 4:
        setOptions((QSaveFileButton *)_o,(Options)*(Int *)&(filter->d).d);
        return;
      }
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == filePathChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QSaveFileButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QSaveFileButton::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSaveFileButton::filePathChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 3: *reinterpret_cast< QStringList*>(_v) = _t->filter(); break;
        case 4: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QSaveFileButton *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setFilter(*reinterpret_cast< QStringList*>(_v)); break;
        case 4: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}